

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

png_fixed_point png_product2(png_fixed_point a,png_fixed_point b)

{
  double dVar1;
  double r;
  png_fixed_point b_local;
  png_fixed_point a_local;
  
  dVar1 = floor((double)b * (double)a * 1e-05 + 0.5);
  if ((2147483647.0 < dVar1) || (dVar1 < -2147483648.0)) {
    b_local = 0;
  }
  else {
    b_local = (png_fixed_point)dVar1;
  }
  return b_local;
}

Assistant:

static png_fixed_point
png_product2(png_fixed_point a, png_fixed_point b)
{
   /* The required result is 1/a * 1/b; the following preserves accuracy. */
#ifdef PNG_FLOATING_ARITHMETIC_SUPPORTED
   double r = a * 1E-5;
   r *= b;
   r = floor(r+.5);

   if (r <= 2147483647. && r >= -2147483648.)
      return (png_fixed_point)r;
#else
   png_fixed_point res;

   if (png_muldiv(&res, a, b, 100000) != 0)
      return res;
#endif

   return 0; /* overflow */
}